

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32m68k.c
# Opt level: O0

void m68k_readconv(GlobalVars *gv,LinkFile *lf)

{
  bool bVar1;
  char *pcVar2;
  long in_RSI;
  ar_info ai;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  ar_info *in_stack_fffffffffffffeb8;
  ar_info *in_stack_ffffffffffffff08;
  _func_uint8_t_uint8_t_RelocInsert_ptr *in_stack_ffffffffffffff28;
  Elf32_Ehdr *in_stack_ffffffffffffff30;
  LinkFile *in_stack_ffffffffffffff38;
  GlobalVars *in_stack_ffffffffffffff40;
  void *local_20;
  
  if (*(char *)(in_RSI + 0x39) == '\b') {
    bVar1 = ar_init(in_stack_fffffffffffffeb8,
                    (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                    CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),(char *)0x12f86a);
    if (bVar1 == 0) {
      ierror("m68k_readconv(): archive %s corrupted since last access",
             *(undefined8 *)(in_RSI + 0x10));
    }
    else {
      while (bVar1 = ar_extract(in_stack_ffffffffffffff08), bVar1 != 0) {
        pcVar2 = allocstring((char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
        *(char **)(in_RSI + 0x20) = pcVar2;
        in_stack_fffffffffffffeb0 = 4;
        elf_check_ar_type(fff[*(byte *)(in_RSI + 0x38)],*(char **)(in_RSI + 0x10),local_20,'\x01',
                          '\x02',1,1);
        elf32_parse(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                    in_stack_ffffffffffffff28);
      }
    }
  }
  else {
    *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RSI + 0x18);
    elf32_parse(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                in_stack_ffffffffffffff28);
  }
  return;
}

Assistant:

static void m68k_readconv(struct GlobalVars *gv,struct LinkFile *lf)
/* Read ELF-68k executable / object / shared obj. */
{
  if (lf->type == ID_LIBARCH) {
    struct ar_info ai;

    if (ar_init(&ai,(char *)lf->data,lf->length,lf->filename)) {
      while (ar_extract(&ai)) {
        lf->objname = allocstring(ai.name);
        elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,
                          ELFCLASS32,ELFDATA2MSB,ELF_VER,1,EM_68K);
        elf32_parse(gv,lf,(struct Elf32_Ehdr *)ai.data,m68k_reloc_elf2vlink);
      }
    }
    else
      ierror("m68k_readconv(): archive %s corrupted since last access",
             lf->pathname);
  }
  else {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(struct Elf32_Ehdr *)lf->data,m68k_reloc_elf2vlink);
  }
}